

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho_corasick_test.cpp
# Opt level: O2

void occurence(int i,int index)

{
  size_type sVar1;
  char *in_R9;
  internal local_60 [8];
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  
  gtest_ar_.message_.ptr_._0_4_ = i;
  gtest_ar_.message_.ptr_._4_4_ = index;
  sVar1 = std::
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::count(&se,(key_type *)&gtest_ar_.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_60[0] = (internal)(sVar1 == 0);
  if (!(bool)local_60[0]) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,local_60,(AssertionResult *)"se.count({i, index})",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/strings/aho_corasick_test.cpp"
               ,0x10,(char *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,(int)gtest_ar_.message_.ptr_));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_);
  gtest_ar_.message_.ptr_._0_4_ = i;
  gtest_ar_.message_.ptr_._4_4_ = index;
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_insert_unique<std::pair<int,int>>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&se,(pair<int,_int> *)&gtest_ar_.message_);
  return;
}

Assistant:

void occurence(int i, int index) {
	EXPECT_FALSE(se.count({i, index}));
	se.insert({i, index});
}